

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogConverterCustomText.h
# Opt level: O1

void __thiscall
nowtech::log::
ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
::append<unsigned_long>
          (ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)_d_,_true,_false>
           *this,unsigned_long aValue,unsigned_long aBase,uint8_t aFill)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  char tmpBuffer [100];
  
  if (0xfffffffffffffff0 < aBase - 0x11) {
    if (aBase == 0x10) {
      if (this->mBegin < this->mEnd) {
        *this->mBegin = '0';
        this->mBegin = this->mBegin + 1;
      }
      if (this->mBegin < this->mEnd) {
        *this->mBegin = 'x';
        goto LAB_00103c20;
      }
    }
    else if (aBase != 10) {
      if (aBase == 2) {
        if (this->mBegin < this->mEnd) {
          *this->mBegin = '0';
          this->mBegin = this->mBegin + 1;
        }
        if (this->mBegin < this->mEnd) {
          *this->mBegin = 'b';
LAB_00103c20:
          this->mBegin = this->mBegin + 1;
        }
      }
      else {
        if (this->mBegin < this->mEnd) {
          *this->mBegin = '0';
          this->mBegin = this->mBegin + 1;
        }
        if (this->mBegin < this->mEnd) {
          *this->mBegin = '!';
          goto LAB_00103c20;
        }
      }
    }
    uVar3 = 0;
    do {
      uVar4 = uVar3;
      tmpBuffer[uVar4] = "0123456789abcdef"[aValue % aBase];
      uVar3 = uVar4 + 1;
      if (aValue < aBase) break;
      aValue = aValue / aBase;
    } while (uVar4 < 99);
    if (uVar4 < 99) {
      if (((byte)uVar3 < aFill) && (aFill != (byte)uVar3)) {
        uVar2 = aFill - uVar3;
        do {
          if (this->mBegin < this->mEnd) {
            *this->mBegin = '0';
            this->mBegin = this->mBegin + 1;
          }
          bVar1 = (char)uVar2 - 1;
          uVar2 = (ulong)bVar1;
        } while (bVar1 != 0);
      }
      if (uVar3 != 1) {
        do {
          uVar3 = uVar4 - 1;
          if (this->mBegin < this->mEnd) {
            *this->mBegin = tmpBuffer[uVar4];
            this->mBegin = this->mBegin + 1;
          }
          uVar4 = uVar3;
        } while ((char)uVar3 != '\0');
      }
      if (this->mEnd <= this->mBegin) {
        return;
      }
      *this->mBegin = tmpBuffer[0];
      goto LAB_00103cc4;
    }
  }
  if (this->mEnd <= this->mBegin) {
    return;
  }
  *this->mBegin = '#';
LAB_00103cc4:
  this->mBegin = this->mBegin + 1;
  return;
}

Assistant:

void append(tValue const aValue, tValue const aBase, uint8_t const aFill) noexcept {
    tValue tmpValue = aValue;
    uint8_t tmpFill = aFill;
    if((aBase <= NumericSystem::csInvalid) || (aBase > NumericSystem::csBaseMax)) {
      append(csNumericError);
      return;
    }
    else { // nothing to do
    }
    if(tAppendBasePrefix) {
      if (aBase == 2u) {
        append(csNumericFill);
        append(csNumericMarkBinary);
      }
      else if(aBase == 16u) {
        append(csNumericFill);
        append(csNumericMarkHexadecimal);
      }
      else if(aBase != 10u) {
        append(csNumericFill);
        append(csNumericMarkOther);
      }
      else { // nothing to do
      }
    }
    char tmpBuffer[tAppendStackBufferSize];
    uint8_t where = 0u;
    bool negative = aValue < 0;
    do {
      tValue mod = tmpValue % aBase;
      if(mod < 0) {
        mod = -mod;
      }
      else { // nothing to do
      }
      tmpBuffer[where] = csDigit2char[mod];
      ++where;
      tmpValue /= aBase;
    } while((tmpValue != 0) && (where < tAppendStackBufferSize));
    if(where >= tAppendStackBufferSize) {
      append(csNumericError);
      return;
    }
    else { // nothing to do
    }
    if(negative) {
      append(csMinus);
    }
    else if(tAlignSigned && (aFill > 0u)) {
      append(csSpace);
    }
    else { // nothing to do
    }
    if(tmpFill > where) {
      tmpFill -= where;
      while(tmpFill > 0u) {
        append(csNumericFill);
        --tmpFill;
      }
    }
    for(--where; where > 0u; --where) {
      append(tmpBuffer[where]);
    }
    append(tmpBuffer[0]);
  }